

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiWindow *pIVar4;
  ImGuiShrinkWidthItem *pIVar5;
  ImVec2 IVar6;
  ImGuiID IVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  ImGuiContext *pIVar16;
  undefined4 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int section_n;
  ImGuiID IVar21;
  int iVar22;
  ImGuiTabItem *pIVar23;
  char *pcVar24;
  ImGuiShrinkWidthItem *__dest;
  char *__dest_00;
  long lVar25;
  ImGuiTabItem *pIVar26;
  long lVar27;
  ImGuiID IVar28;
  ImGuiID *pIVar29;
  int iVar30;
  uint uVar31;
  ImGuiTabItem *pIVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  byte bVar36;
  uint uVar37;
  ImGuiContext *pIVar38;
  int iVar39;
  long lVar40;
  uint uVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  float fVar52;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  float local_110;
  undefined8 local_100;
  float local_f8 [3];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  int local_9c [2];
  float local_94;
  ImVec2 local_90;
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImVec4 local_78;
  undefined8 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar38 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0;
  uVar37 = (tab_bar->Tabs).Size;
  if ((int)uVar37 < 1) {
    bVar36 = 0;
    uVar41 = 0;
  }
  else {
    pIVar32 = (tab_bar->Tabs).Data;
    lVar25 = 0;
    uVar33 = 0;
    uVar41 = 0;
    bVar36 = 0;
    do {
      pIVar29 = (ImGuiID *)((long)&pIVar32->ID + lVar25);
      if ((*(int *)((long)&pIVar32->LastFrameVisible + lVar25) < tab_bar->PrevFrameVisible) ||
         ((&pIVar32->WantClose)[lVar25] == true)) {
        IVar28 = *pIVar29;
        if (tab_bar->VisibleTabId == IVar28) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar28) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar28) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar35 = (ulong)uVar41;
        if (uVar33 != uVar35) {
          if (((int)uVar41 < 0) || ((int)uVar37 <= (int)uVar41)) goto LAB_002b9f80;
          IVar28 = *pIVar29;
          IVar21 = pIVar29[1];
          IVar7 = pIVar29[2];
          IVar8 = pIVar29[3];
          IVar9 = pIVar29[4];
          IVar10 = pIVar29[5];
          fVar42 = (float)pIVar29[6];
          fVar47 = (float)pIVar29[7];
          *(undefined1 (*) [16])((long)&pIVar32[uVar35].Offset + 3) =
               *(undefined1 (*) [16])((long)pIVar29 + 0x1b);
          piVar1 = &pIVar32[uVar35].LastFrameVisible;
          *piVar1 = IVar9;
          piVar1[1] = IVar10;
          piVar1[2] = (int)fVar42;
          piVar1[3] = (int)fVar47;
          pIVar32 = pIVar32 + uVar35;
          pIVar32->ID = IVar28;
          pIVar32->Flags = IVar21;
          *(ImGuiID *)&pIVar32->Window = IVar7;
          *(ImGuiID *)((long)&pIVar32->Window + 4) = IVar8;
          uVar37 = (tab_bar->Tabs).Size;
        }
        if ((int)uVar37 <= (int)uVar41) goto LAB_002b9f80;
        pIVar32 = (tab_bar->Tabs).Data;
        pIVar32[uVar35].IndexDuringLayout = (ImS16)uVar41;
        uVar34 = pIVar32[uVar35].Flags;
        lVar40 = 0;
        if ((uVar34 & 0x40) == 0) {
          lVar40 = (ulong)((char)(byte)uVar34 < '\0') + 1;
        }
        if (uVar41 != 0) {
          if ((int)uVar37 < (int)uVar41) goto LAB_002b9f80;
          bVar36 = (pIVar32[(long)(int)uVar41 + -1].Flags & 0x40U) == 0 & (byte)uVar34 >> 6 | bVar36
                   | ((uVar34 & 0xc0) != 0x80 &&
                     (pIVar32[(long)(int)uVar41 + -1].Flags & 0xc0U) == 0x80);
        }
        local_f8[lVar40 * 3] = (float)((int)local_f8[lVar40 * 3] + 1);
        uVar41 = uVar41 + 1;
      }
      uVar33 = uVar33 + 1;
      lVar25 = lVar25 + 0x30;
    } while ((long)uVar33 < (long)(int)uVar37);
  }
  if (uVar37 != uVar41) {
    iVar30 = (tab_bar->Tabs).Capacity;
    if (iVar30 < (int)uVar41) {
      if (iVar30 == 0) {
        uVar37 = 8;
      }
      else {
        uVar37 = iVar30 / 2 + iVar30;
      }
      if ((int)uVar37 <= (int)uVar41) {
        uVar37 = uVar41;
      }
      pIVar23 = (ImGuiTabItem *)MemAlloc((long)(int)uVar37 * 0x30);
      pIVar32 = (tab_bar->Tabs).Data;
      if (pIVar32 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar23,pIVar32,(long)(tab_bar->Tabs).Size * 0x30);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar23;
      (tab_bar->Tabs).Capacity = uVar37;
    }
    (tab_bar->Tabs).Size = uVar41;
  }
  if (bVar36 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(int)uVar41,0x30,TabItemComparerBySection);
  }
  fVar47 = local_f8[0];
  uVar37 = uStack_ec;
  iVar30 = (int)uStack_e0;
  fVar42 = 0.0;
  local_110 = 0.0;
  if (0 < (int)((int)uStack_e0 + uStack_ec) && 0 < (int)local_f8[0]) {
    fVar42 = (pIVar38->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,fVar42);
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    local_110 = (pIVar38->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(local_110,(float)local_e8);
  IVar28 = tab_bar->NextSelectedTabId;
  if (IVar28 != 0) {
    tab_bar->SelectedTabId = IVar28;
    tab_bar->NextSelectedTabId = 0;
  }
  local_100 = pIVar38;
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar18 = TabBarProcessReorder(tab_bar);
    if ((bVar18) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      IVar28 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar38 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar4 = GImGui->CurrentWindow;
    fVar43 = (GImGui->Style).FramePadding.y;
    fVar45 = GImGui->FontSize;
    local_c8._0_4_ = (pIVar4->DC).CursorPos.x;
    local_c8._4_4_ = (pIVar4->DC).CursorPos.y;
    fVar44 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar43;
    (pIVar4->DC).CursorPos.y = fVar44;
    (tab_bar->BarRect).Min.x = fVar45 + fVar43 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar38->Style).Colors[0].x;
    local_58.y = (pIVar38->Style).Colors[0].y;
    uVar11 = (pIVar38->Style).Colors[0].z;
    uVar12 = (pIVar38->Style).Colors[0].w;
    local_58.w = (float)uVar12 * 0.5;
    local_58.z = (float)uVar11;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar18 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar18) {
      iVar39 = (tab_bar->Tabs).Size;
      if (0 < iVar39) {
        local_b8._0_8_ = pIVar4;
        lVar25 = 0;
        lVar40 = 0;
        pIVar32 = (ImGuiTabItem *)0x0;
        do {
          pIVar23 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar23->Flags + lVar25 + 2) & 0x20) == 0) {
            pIVar23 = (ImGuiTabItem *)((long)&pIVar23->ID + lVar25);
            pcVar24 = ImGuiTabBar::GetTabName(tab_bar,pIVar23);
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar18 = Selectable(pcVar24,tab_bar->SelectedTabId == pIVar23->ID,0,(ImVec2 *)&local_78)
            ;
            if (bVar18) {
              pIVar32 = pIVar23;
            }
            iVar39 = (tab_bar->Tabs).Size;
          }
          lVar40 = lVar40 + 1;
          lVar25 = lVar25 + 0x30;
        } while (lVar40 < iVar39);
        EndPopup();
        *(undefined8 *)(local_b8._0_8_ + 0x118) = local_c8._0_8_;
        if (pIVar32 != (ImGuiTabItem *)0x0) {
          IVar28 = pIVar32->ID;
          tab_bar->SelectedTabId = IVar28;
        }
        goto LAB_002b94b9;
      }
      EndPopup();
    }
    auVar50 = local_c8;
    (pIVar4->DC).CursorPos.x = (float)local_c8._0_4_;
    (pIVar4->DC).CursorPos.y = (float)local_c8._4_4_;
    local_c8 = auVar50;
  }
LAB_002b94b9:
  pIVar38 = local_100;
  local_9c[0] = 0;
  local_9c[1] = iVar30 + (int)fVar47;
  local_94 = fVar47;
  iVar30 = (tab_bar->Tabs).Size;
  iVar39 = (local_100->ShrinkWidthBuffer).Capacity;
  iVar22 = iVar30;
  if (iVar39 < iVar30) {
    if (iVar39 == 0) {
      iVar39 = 8;
    }
    else {
      iVar39 = iVar39 / 2 + iVar39;
    }
    if (iVar39 <= iVar30) {
      iVar39 = iVar30;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar39 << 3);
    pIVar5 = (pIVar38->ShrinkWidthBuffer).Data;
    if (pIVar5 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar5,(long)(pIVar38->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar38->ShrinkWidthBuffer).Data);
    }
    (pIVar38->ShrinkWidthBuffer).Data = __dest;
    (pIVar38->ShrinkWidthBuffer).Capacity = iVar39;
    iVar22 = (tab_bar->Tabs).Size;
  }
  (pIVar38->ShrinkWidthBuffer).Size = iVar30;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_b8._8_8_;
  local_b8 = auVar50 << 0x40;
  if (iVar22 < 1) {
    bVar18 = true;
    pIVar29 = (ImGuiID *)0x0;
  }
  else {
    lVar40 = 0;
    lVar25 = 0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_c8._8_8_;
    local_c8 = auVar15 << 0x40;
    bVar18 = false;
    iVar30 = -1;
    do {
      pIVar32 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar32->LastFrameVisible + lVar40) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0x1bc9,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar23 = (ImGuiTabItem *)((long)&pIVar32->ID + lVar40);
      if (((ImGuiTabItem *)local_c8._0_8_ == (ImGuiTabItem *)0x0) ||
         (*(int *)(local_c8._0_8_ + 0x14) < *(int *)((long)&pIVar32->LastFrameSelected + lVar40))) {
        pIVar26 = (ImGuiTabItem *)local_c8._0_8_;
        if ((*(byte *)((long)&pIVar32->Flags + lVar40 + 2) & 0x20) == 0) {
          pIVar26 = pIVar23;
        }
        local_c8._0_8_ = pIVar26;
      }
      IVar21 = pIVar23->ID;
      if (IVar21 == tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      if ((IVar28 == 0) && (IVar28 = IVar21, local_100->NavJustMovedToId != IVar21)) {
        IVar28 = 0;
      }
      pcVar24 = ImGuiTabBar::GetTabName(tab_bar,pIVar23);
      IVar6 = TabItemCalcSize(pcVar24,(*(uint *)((long)&pIVar32->Flags + lVar40) >> 0x14 & 1) == 0);
      auVar50 = local_b8;
      fVar43 = IVar6.x;
      *(float *)((long)&pIVar32->ContentWidth + lVar40) = fVar43;
      uVar41 = *(uint *)((long)&pIVar32->Flags + lVar40);
      uVar33 = (ulong)(((char)uVar41 < '\0') + 1);
      if ((uVar41 & 0x40) != 0) {
        uVar33 = 0;
      }
      fVar45 = 0.0;
      if ((int)uVar33 == iVar30) {
        fVar45 = (local_100->Style).ItemInnerSpacing.x;
      }
      local_f8[uVar33 * 3 + 1] = fVar45 + fVar43 + local_f8[uVar33 * 3 + 1];
      iVar30 = local_9c[uVar33];
      lVar27 = (long)iVar30;
      local_9c[uVar33] = iVar30 + 1;
      if ((lVar27 < 0) || ((local_100->ShrinkWidthBuffer).Size <= iVar30)) goto LAB_002b9f9f;
      pIVar5 = (local_100->ShrinkWidthBuffer).Data;
      pIVar5[lVar27].Index = (int)lVar25;
      if ((local_100->ShrinkWidthBuffer).Size <= iVar30) goto LAB_002b9f9f;
      pIVar5[lVar27].Width = fVar43;
      if (fVar43 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                      ,0x1be3,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&pIVar32->Width + lVar40) = fVar43;
      lVar25 = lVar25 + 1;
      iVar39 = (tab_bar->Tabs).Size;
      lVar40 = lVar40 + 0x30;
      iVar30 = (int)uVar33;
    } while (lVar25 < iVar39);
    local_b8._1_7_ = 0;
    local_b8[0] = 1 < iVar39;
    local_b8._8_8_ = auVar50._8_8_;
    bVar18 = !bVar18;
    pIVar29 = (ImGuiID *)local_c8._0_8_;
    pIVar38 = local_100;
  }
  fVar43 = 0.0;
  lVar25 = 8;
  do {
    fVar43 = fVar43 + *(float *)((long)&local_100 + lVar25 + 4) +
                      *(float *)((long)local_f8 + lVar25);
    lVar25 = lVar25 + 0xc;
  } while (lVar25 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar43;
  pIVar16 = GImGui;
  fVar45 = (tab_bar->BarRect).Max.x;
  if (((local_b8[0] & fVar45 - (tab_bar->BarRect).Min.x < fVar43) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar4 = GImGui->CurrentWindow;
    fVar45 = GImGui->FontSize + -2.0;
    local_c8 = ZEXT416((uint)fVar45);
    fVar43 = (GImGui->Style).FramePadding.y;
    _local_88 = ZEXT416((uint)(fVar43 + fVar43 + GImGui->FontSize));
    local_b8 = ZEXT416((uint)(fVar45 + fVar45));
    local_90 = (pIVar4->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar13 = (GImGui->Style).Colors[0].z;
    uVar14 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar14 * 0.5;
    local_58.z = (float)uVar13;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_60._0_4_ = (pIVar16->IO).KeyRepeatDelay;
    local_60._4_4_ = (pIVar16->IO).KeyRepeatRate;
    (pIVar16->IO).KeyRepeatDelay = 0.25;
    (pIVar16->IO).KeyRepeatRate = 0.2;
    fVar43 = (tab_bar->BarRect).Min.x;
    fVar45 = (tab_bar->BarRect).Max.x - (float)local_b8._0_4_;
    uVar41 = -(uint)(fVar45 <= fVar43);
    fVar45 = (float)(uVar41 & (uint)fVar43 | ~uVar41 & (uint)fVar45);
    local_48 = ZEXT416((uint)fVar45);
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = fVar45;
    (pIVar4->DC).CursorPos.y = fVar43;
    uVar17 = local_88._0_4_;
    uStack_7c = local_88._4_4_;
    local_88._4_4_ = local_88._0_4_;
    local_88._0_4_ = local_c8._0_4_;
    uStack_80 = local_c8._4_4_;
    IVar6.y = (float)uVar17;
    IVar6.x = (float)local_c8._0_4_;
    bVar19 = ArrowButtonEx("##<",0,IVar6,0x410);
    fVar43 = (tab_bar->BarRect).Min.y;
    (pIVar4->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_c8._0_4_;
    (pIVar4->DC).CursorPos.y = fVar43;
    bVar20 = ArrowButtonEx("##>",1,(ImVec2)local_88,0x410);
    iVar30 = -(uint)bVar19;
    if (bVar20) {
      iVar30 = 1;
    }
    PopStyleColor(2);
    (pIVar16->IO).KeyRepeatDelay = (float)(undefined4)local_60;
    (pIVar16->IO).KeyRepeatRate = (float)local_60._4_4_;
    if (((iVar30 != 0) && (tab_bar->SelectedTabId != 0)) &&
       (lVar25 = (long)(tab_bar->Tabs).Size, 0 < lVar25)) {
      pIVar32 = (tab_bar->Tabs).Data;
      do {
        if (pIVar32->ID == tab_bar->SelectedTabId) {
          uVar41 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar32);
          iVar39 = (tab_bar->Tabs).Size;
          goto LAB_002b9f01;
        }
        pIVar32 = pIVar32 + 1;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    (pIVar4->DC).CursorPos = local_90;
    fVar45 = (tab_bar->BarRect).Max.x - ((float)local_b8._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar45;
    pIVar38 = local_100;
  }
  goto LAB_002b9966;
LAB_002b9f9f:
  pcVar24 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_002b9f95;
LAB_002b9f80:
  pcVar24 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_002b9f95:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                ,0x688,pcVar24);
  while( true ) {
    pIVar32 = (tab_bar->Tabs).Data;
    if (((pIVar32[uVar34].Flags & 0x200000) == 0) ||
       ((iVar22 = uVar41 + iVar30 * 2, iVar22 < 0 || (uVar41 = uVar31, iVar39 <= iVar22)))) break;
LAB_002b9f01:
    uVar31 = iVar30 + uVar41;
    uVar34 = uVar41;
    if ((int)uVar31 < iVar39) {
      uVar34 = uVar31;
    }
    if ((int)uVar31 < 0) {
      uVar34 = uVar41;
    }
    if (((int)uVar34 < 0) || (iVar39 <= (int)uVar34)) goto LAB_002b9f80;
  }
  pIVar32 = pIVar32 + uVar34;
  (pIVar4->DC).CursorPos = local_90;
  fVar45 = (tab_bar->BarRect).Max.x - ((float)local_b8._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar45;
  IVar28 = pIVar32->ID;
  pIVar38 = local_100;
  if ((pIVar32->Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = IVar28;
  }
LAB_002b9966:
  fVar43 = local_f8[1] + fVar42 + uStack_e0._4_4_ + 0.0;
  fVar45 = fVar45 - (tab_bar->BarRect).Min.x;
  if (fVar43 < fVar45) {
    fVar44 = ((float)local_e8 + local_110) -
             ((fVar45 - (local_f8[1] + fVar42)) - (uStack_e0._4_4_ + 0.0));
    if (0.0 <= fVar44) goto LAB_002b99be;
  }
  else {
    fVar44 = fVar43 - fVar45;
LAB_002b99be:
    if ((0.0 < fVar44) && ((fVar45 <= fVar43 || ((tab_bar->Flags & 0x40U) != 0)))) {
      if (fVar45 <= fVar43) {
        uVar37 = (int)uStack_e0 + (int)fVar47;
      }
      uVar41 = 0;
      if (fVar43 < fVar45) {
        uVar41 = (int)uStack_e0 + (int)fVar47;
      }
      ShrinkWidths((pIVar38->ShrinkWidthBuffer).Data + (int)uVar41,uVar37,fVar44);
      if (0 < (int)uVar37) {
        uVar33 = (ulong)uVar41;
        do {
          if (((int)uVar41 < 0) || ((pIVar38->ShrinkWidthBuffer).Size <= (int)uVar33))
          goto LAB_002b9f9f;
          pIVar5 = (pIVar38->ShrinkWidthBuffer).Data;
          iVar30 = pIVar5[uVar33].Index;
          lVar25 = (long)iVar30;
          if ((lVar25 < 0) || ((tab_bar->Tabs).Size <= iVar30)) goto LAB_002b9f80;
          iVar30 = (int)pIVar5[uVar33].Width;
          if (-1 < iVar30) {
            fVar43 = (float)iVar30;
            pIVar32 = (tab_bar->Tabs).Data;
            lVar40 = (ulong)((char)pIVar32[lVar25].Flags < '\0') + 1;
            if ((pIVar32[lVar25].Flags & 0x40U) != 0) {
              lVar40 = 0;
            }
            local_f8[lVar40 * 3 + 1] = local_f8[lVar40 * 3 + 1] - (pIVar32[lVar25].Width - fVar43);
            pIVar32[lVar25].Width = fVar43;
          }
          uVar33 = uVar33 + 1;
        } while ((int)uVar33 < (int)(uVar37 + uVar41));
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar25 = 0;
  fVar45 = 0.0;
  fVar43 = 0.0;
  uVar37 = 0;
  do {
    fVar44 = fVar43;
    if ((lVar25 == 2) &&
       (fVar44 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_f8[7],
       fVar44 = (float)(~-(uint)(fVar44 <= 0.0) & (uint)fVar44), fVar43 <= fVar44)) {
      fVar44 = fVar43;
    }
    fVar46 = local_f8[lVar25 * 3];
    if (0 < (long)(int)fVar46) {
      lVar40 = (ulong)uVar37 * 0x30;
      uVar33 = 0;
      do {
        if (((int)uVar37 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar37 + (int)uVar33)))
        goto LAB_002b9f80;
        pIVar32 = (tab_bar->Tabs).Data;
        *(float *)((long)&pIVar32->Offset + lVar40) = fVar44;
        *(undefined2 *)((long)&pIVar32->NameOffset + lVar40) = 0xffff;
        fVar43 = 0.0;
        if (uVar33 < (int)fVar46 - 1) {
          fVar43 = (pIVar38->Style).ItemInnerSpacing.x;
        }
        fVar44 = fVar44 + fVar43 + *(float *)((long)&pIVar32->Width + lVar40);
        uVar33 = uVar33 + 1;
        lVar40 = lVar40 + 0x30;
      } while ((long)(int)fVar46 != uVar33);
    }
    fVar43 = local_f8[lVar25 * 3 + 2];
    fVar51 = local_f8[lVar25 * 3 + 1] + fVar43;
    fVar45 = fVar45 + (float)(-(uint)(0.0 <= fVar51) & (uint)fVar51);
    tab_bar->WidthAllTabs = fVar45;
    fVar43 = fVar44 + fVar43;
    uVar37 = (int)fVar46 + uVar37;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 3);
  if ((tab_bar->TabsNames).Buf.Capacity < 0) {
    __dest_00 = (char *)MemAlloc(0);
    pcVar24 = (tab_bar->TabsNames).Buf.Data;
    if (pcVar24 != (char *)0x0) {
      memcpy(__dest_00,pcVar24,(long)(tab_bar->TabsNames).Buf.Size);
      MemFree((tab_bar->TabsNames).Buf.Data);
    }
    (tab_bar->TabsNames).Buf.Data = __dest_00;
    (tab_bar->TabsNames).Buf.Capacity = 0;
  }
  (tab_bar->TabsNames).Buf.Size = 0;
  if (bVar18) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    IVar21 = tab_bar->SelectedTabId;
    if (IVar21 != 0) goto LAB_002b9c19;
  }
  IVar21 = 0;
  if ((tab_bar->NextSelectedTabId == 0) && (IVar21 = 0, pIVar29 != (ImGuiID *)0x0)) {
    IVar21 = *pIVar29;
    tab_bar->SelectedTabId = IVar21;
    IVar28 = IVar21;
  }
LAB_002b9c19:
  tab_bar->VisibleTabId = IVar21;
  tab_bar->VisibleTabWasSubmitted = false;
  pIVar4 = pIVar38->NavWindowingTarget;
  if (((pIVar4 != (ImGuiWindow *)0x0) && (pIVar4->DockNode != (ImGuiDockNode *)0x0)) &&
     (pIVar4->DockNode->TabBar == tab_bar)) {
    IVar28 = pIVar4->ID;
    tab_bar->VisibleTabId = IVar28;
  }
  if ((IVar28 != 0) && (lVar25 = (long)(tab_bar->Tabs).Size, 0 < lVar25)) {
    pIVar32 = (tab_bar->Tabs).Data;
    do {
      if (pIVar32->ID == IVar28) {
        if ((pIVar32->Flags & 0xc0) != 0) break;
        fVar43 = GImGui->FontSize;
        iVar30 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar32);
        fVar45 = (tab_bar->BarRect).Max.x;
        fVar44 = (tab_bar->BarRect).Min.x;
        fVar51 = pIVar32->Offset - local_f8[1];
        fVar46 = fVar43;
        if (iVar30 < (int)fVar47) {
          fVar46 = -0.0;
        }
        fVar46 = fVar51 - fVar46;
        if ((tab_bar->Tabs).Size - (int)uStack_e0 <= iVar30 + 1) {
          fVar43 = 1.0;
        }
        fVar43 = fVar51 + pIVar32->Width + fVar43;
        tab_bar->ScrollingTargetDistToVisibility = 0.0;
        if ((fVar46 < tab_bar->ScrollingTarget) ||
           (fVar47 = (((fVar45 - fVar44) - local_f8[1]) - uStack_e0._4_4_) - local_110,
           fVar47 <= fVar43 - fVar46)) {
          fVar45 = tab_bar->ScrollingAnim - fVar43;
        }
        else {
          if (fVar43 - fVar47 <= tab_bar->ScrollingTarget) break;
          fVar45 = (fVar46 - fVar47) - tab_bar->ScrollingAnim;
          fVar46 = fVar43 - fVar47;
        }
        tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar45) & (uint)fVar45);
        tab_bar->ScrollingTarget = fVar46;
        break;
      }
      pIVar32 = pIVar32 + 1;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  fVar47 = (tab_bar->BarRect).Min.x;
  fVar43 = (tab_bar->BarRect).Max.x;
  auVar48._0_4_ = tab_bar->WidthAllTabs - (fVar43 - fVar47);
  uVar2 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar49._4_4_ = uVar3;
  auVar49._0_4_ = uVar2;
  auVar49._8_8_ = 0;
  auVar48._4_4_ = auVar48._0_4_;
  auVar48._8_4_ = auVar48._0_4_;
  auVar48._12_4_ = auVar48._0_4_;
  auVar50 = minps(auVar49,auVar48);
  fVar45 = (float)(-(uint)(0.0 <= auVar50._0_4_) & (uint)auVar50._0_4_);
  fVar44 = (float)(-(uint)(0.0 <= auVar50._4_4_) & (uint)auVar50._4_4_);
  tab_bar->ScrollingAnim = fVar45;
  tab_bar->ScrollingTarget = fVar44;
  if ((fVar45 != fVar44) || (NAN(fVar45) || NAN(fVar44))) {
    fVar46 = pIVar38->FontSize;
    fVar51 = fVar46 * 70.0;
    uVar37 = -(uint)(fVar51 <= tab_bar->ScrollingSpeed);
    fVar52 = ABS(fVar44 - fVar45) / 0.3;
    fVar51 = (float)(~uVar37 & (uint)fVar51 | (uint)tab_bar->ScrollingSpeed & uVar37);
    uVar37 = -(uint)(fVar52 <= fVar51);
    fVar52 = (float)(~uVar37 & (uint)fVar52 | uVar37 & (uint)fVar51);
    tab_bar->ScrollingSpeed = fVar52;
    fVar51 = fVar44;
    if ((pIVar38->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar46 * 10.0)) {
      fVar52 = fVar52 * (pIVar38->IO).DeltaTime;
      if (fVar44 <= fVar45) {
        fVar51 = fVar45;
        if (fVar44 < fVar45) {
          fVar45 = fVar45 - fVar52;
          uVar37 = -(uint)(fVar44 <= fVar45);
          fVar51 = (float)((uint)fVar45 & uVar37 | ~uVar37 & (uint)fVar44);
        }
      }
      else {
        fVar51 = fVar45 + fVar52;
        if (fVar44 <= fVar51) {
          fVar51 = fVar44;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar51;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar42 + fVar47 + local_f8[1];
  tab_bar->ScrollingRectMaxX = (fVar43 - uStack_e0._4_4_) - local_110;
  (pIVar38->CurrentWindow->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabsIdeal;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab->NameOffset = -1;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // Clear name buffers
    tab_bar->TabsNames.Buf.resize(0);

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // CTRL+TAB can override visible tab temporarily
    if (g.NavWindowingTarget != NULL && g.NavWindowingTarget->DockNode && g.NavWindowingTarget->DockNode->TabBar == tab_bar)
        tab_bar->VisibleTabId = scroll_track_selected_tab_id = g.NavWindowingTarget->ID;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}